

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O3

void Imath_3_2::extractEulerXYZ<float>(Matrix44<float> *mat,Vec3<float> *rot)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  uint extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vec3<float> local_a8;
  Vec3<float> local_98;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  Vec3<float> local_48;
  float local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  float local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_98.z = mat->x[0][2];
  uVar6 = 0;
  local_98._0_8_ = *(undefined8 *)mat->x[0];
  fVar11 = mat->x[1][2];
  local_a8._0_8_ = *(undefined8 *)mat->x[1];
  local_48.z = mat->x[2][2];
  uVar1._0_4_ = *(float *)((long)(mat->x + 2) + 0);
  uVar1._4_4_ = *(float *)((long)(mat->x + 2) + 4);
  fVar5 = (float)((ulong)local_98._0_8_ >> 0x20);
  fVar5 = local_98.z * local_98.z + (float)local_98._0_8_ * (float)local_98._0_8_ + fVar5 * fVar5;
  local_a8.z = fVar11;
  local_48._0_8_ = uVar1;
  if (fVar5 < 2.3509887e-38) {
    stack0xffffffffffffff90 = 0;
    uStack_50 = 0;
    local_88 = local_48.z;
    local_78._0_8_ = uVar1;
    local_58 = local_a8._0_8_;
    fVar5 = Vec3<float>::lengthTiny(&local_98);
    uVar6 = extraout_XMM0_Db_00;
    uVar1._0_4_ = (float)local_78._0_4_;
    uVar1._4_4_ = (float)local_78._4_4_;
    uStack_80 = local_78._8_4_;
    uStack_7c = uStack_6c;
    fVar12 = local_88;
    fVar13 = (float)local_58;
    fVar7 = local_58._4_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
    uStack_80 = 0;
    uStack_7c = 0;
    fVar12 = local_48.z;
    fVar13 = (float)local_a8._0_8_;
    fVar7 = (float)((ulong)local_a8._0_8_ >> 0x20);
  }
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    auVar8._8_8_ = 0;
    auVar8._0_4_ = local_98.x;
    auVar8._4_4_ = local_98.y;
    auVar9._4_4_ = fVar5;
    auVar9._0_4_ = fVar5;
    auVar9._8_4_ = uVar6;
    auVar9._12_4_ = uVar6;
    auVar9 = divps(auVar8,auVar9);
    local_98._0_8_ = auVar9._0_8_;
    local_98.z = local_98.z / fVar5;
  }
  fVar7 = fVar7 * fVar7;
  fVar11 = fVar11 * fVar11 + fVar13 * fVar13 + fVar7;
  if (fVar11 < 2.3509887e-38) {
    local_78._4_4_ = uVar1._4_4_;
    local_78._0_4_ = (float)uVar1;
    stack0xffffffffffffff90 = CONCAT44(uStack_7c,uStack_80);
    local_88 = fVar12;
    fVar11 = Vec3<float>::lengthTiny(&local_a8);
    fVar7 = extraout_XMM0_Db_01;
    uVar1._0_4_ = (float)local_78._0_4_;
    fStack_84 = (float)local_78._4_4_;
    uStack_80 = local_78._8_4_;
    uStack_7c = uStack_6c;
    fVar12 = local_88;
  }
  else {
    fVar11 = SQRT(fVar11);
    fStack_84 = uVar1._4_4_;
  }
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    auVar10._8_8_ = 0;
    auVar10._0_4_ = local_a8.x;
    auVar10._4_4_ = local_a8.y;
    auVar4._4_4_ = fVar11;
    auVar4._0_4_ = fVar11;
    auVar4._8_4_ = fVar7;
    auVar4._12_4_ = fVar7;
    auVar9 = divps(auVar10,auVar4);
    local_a8._0_8_ = auVar9._0_8_;
    local_a8.z = local_a8.z / fVar11;
  }
  fVar11 = fVar12 * fVar12 + (float)uVar1 * (float)uVar1 + fStack_84 * fStack_84;
  if (fVar11 < 2.3509887e-38) {
    fVar11 = Vec3<float>::lengthTiny(&local_48);
    fStack_84 = 0.0;
    uStack_80 = 0;
    uStack_7c = 0;
    uVar1._0_4_ = local_48.x;
    uVar1._4_4_ = local_48.y;
    fVar12 = local_48.z;
  }
  else {
    fVar11 = SQRT(fVar11);
    uVar1._4_4_ = fStack_84;
  }
  bVar2 = NAN(fVar11);
  bVar3 = fVar11 == 0.0;
  local_28 = fVar12 / fVar11;
  if ((bVar3) && (!bVar2)) {
    local_28 = fVar12;
  }
  fVar5 = uVar1._4_4_ / fVar11;
  if ((bVar3) && (!bVar2)) {
    fVar5 = uVar1._4_4_;
  }
  local_88 = (float)uVar1 / fVar11;
  if ((bVar3) && (!bVar2)) {
    local_88 = (float)uVar1;
  }
  local_60 = local_98.x;
  local_58 = CONCAT44(local_58._4_4_,local_98.y);
  local_64 = local_a8.x;
  local_5c = local_a8.y;
  uVar1._4_4_ = local_a8.z * 0.0 + local_98.z;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_78._0_4_ = fVar5;
  local_38 = atan2f(local_a8.z,local_28);
  rot->x = local_38;
  local_38 = -local_38;
  uStack_34 = extraout_XMM0_Db ^ 0x80000000;
  uStack_30 = extraout_XMM0_Dc ^ 0x80000000;
  uStack_2c = extraout_XMM0_Dd ^ 0x80000000;
  local_68 = cosf(local_38);
  fVar11 = sinf(local_38);
  fVar7 = fVar11 * 0.0;
  uVar1._0_4_ = local_68 * -0.0 + fVar7;
  fVar12 = (local_68 + fVar7) * 0.0;
  fVar5 = (float)uVar1 + fVar12 + fVar7;
  uVar1._0_4_ = (float)uVar1 * 0.0;
  fVar14 = local_68 + fVar7 + (float)uVar1 + fVar7;
  uVar1._0_4_ = (float)uVar1 + fVar12;
  fVar11 = fVar11 + (float)uVar1;
  fVar12 = local_88 * 0.0 + local_64 * 0.0 + local_60 + 0.0;
  fVar13 = (float)local_78._0_4_ * 0.0 + local_5c * 0.0 + (float)local_58 + 0.0;
  uVar1._0_4_ = ((float)uVar1 + fVar7) * 0.0;
  local_88 = local_88 * fVar11 + local_60 * fVar5 + local_64 * fVar14 + (float)uVar1;
  local_78._0_4_ =
       (float)local_78._0_4_ * fVar11 + fVar5 * (float)local_58 + fVar14 * local_5c + (float)uVar1;
  fVar11 = atan2f(-(local_28 * 0.0 + uVar1._4_4_ + 0.0),SQRT(fVar12 * fVar12 + fVar13 * fVar13));
  rot->y = fVar11;
  fVar11 = atan2f(-local_88,(float)local_78._0_4_);
  rot->z = fVar11;
  return;
}

Assistant:

void
extractEulerXYZ (const Matrix44<T>& mat, Vec3<T>& rot)
{
    //
    // Normalize the local x, y and z axes to remove scaling.
    //

    Vec3<T> i (mat[0][0], mat[0][1], mat[0][2]);
    Vec3<T> j (mat[1][0], mat[1][1], mat[1][2]);
    Vec3<T> k (mat[2][0], mat[2][1], mat[2][2]);

    i.normalize ();
    j.normalize ();
    k.normalize ();

    Matrix44<T> M (
        i[0],
        i[1],
        i[2],
        0,
        j[0],
        j[1],
        j[2],
        0,
        k[0],
        k[1],
        k[2],
        0,
        0,
        0,
        0,
        1);

    //
    // Extract the first angle, rot.x.
    //

    rot.x = std::atan2 (M[1][2], M[2][2]);

    //
    // Remove the rot.x rotation from M, so that the remaining
    // rotation, N, is only around two axes, and gimbal lock
    // cannot occur.
    //

    Matrix44<T> N;
    N.rotate (Vec3<T> (-rot.x, 0, 0));
    N = N * M;

    //
    // Extract the other two angles, rot.y and rot.z, from N.
    //

    T cy  = std::sqrt (N[0][0] * N[0][0] + N[0][1] * N[0][1]);
    rot.y = std::atan2 (-N[0][2], cy);
    rot.z = std::atan2 (-N[1][0], N[1][1]);
}